

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall
ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test::
~ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test
          (ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ConfigurationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ConfigurationTest_0015f0d0;
  pcVar2 = (this->super_ConfigurationTest).filename._M_dataplus._M_p;
  paVar1 = &(this->super_ConfigurationTest).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(ConfigurationTest, shouldThrowExceptionOnIncorrectFilename) {
    EXPECT_ANY_THROW(aeron::archive::Configuration cfg("I tHinK this FileNAmE shOulD n0t exIst"));
}